

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  long lVar4;
  BN_CTX *in_RCX;
  undefined8 in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  BIGNUM *y;
  BIGNUM *x;
  uchar b_n [64];
  uchar b_y [64];
  uchar b_x [64];
  int ret;
  undefined1 local_e8 [64];
  undefined1 local_a8 [40];
  uchar *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  undefined1 local_68 [68];
  int local_24;
  BN_CTX *local_20;
  undefined8 local_18;
  EC_POINT *local_10;
  EC_GROUP *local_8;
  
  local_24 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  BN_CTX_start(in_RCX);
  pBVar2 = BN_CTX_get(local_20);
  pBVar3 = BN_CTX_get(local_20);
  if ((pBVar3 != (BIGNUM *)0x0) && (iVar1 = BN_bn2lebinpad(local_18,local_e8,0x40), iVar1 == 0x40))
  {
    point_mul_g(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    iVar1 = CRYPTO_memcmp("",local_68,0x40);
    if ((iVar1 == 0) && (iVar1 = CRYPTO_memcmp("",local_a8,0x40), iVar1 == 0)) {
      iVar1 = EC_POINT_set_to_infinity(local_8,local_10);
    }
    else {
      lVar4 = BN_lebin2bn(local_68,0x40,pBVar2);
      if ((lVar4 == 0) || (lVar4 = BN_lebin2bn(local_a8,0x40,pBVar3), lVar4 == 0))
      goto LAB_0015e058;
      iVar1 = EC_POINT_set_affine_coordinates(local_8,local_10,pBVar2,pBVar3,local_20);
    }
    if (iVar1 != 0) {
      local_24 = 1;
    }
  }
LAB_0015e058:
  BN_CTX_end(local_20);
  return local_24;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}